

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O1

plutovg_surface_t *
plutosvg_document_render_to_surface
          (plutosvg_document_t *document,char *id,int width,int height,
          plutovg_color_t *current_color,plutosvg_palette_func_t palette_func,void *closure)

{
  float fVar1;
  float fVar2;
  _Bool _Var3;
  plutovg_surface_t *surface;
  plutovg_canvas_t *canvas;
  float fVar4;
  plutovg_rect_t local_50;
  plutosvg_palette_func_t local_40;
  plutovg_color_t *local_38;
  
  local_50.x = 0.0;
  local_50.y = 0.0;
  local_50.w = document->width;
  local_50.h = document->height;
  if ((id != (char *)0x0) && (_Var3 = plutosvg_document_extents(document,id,&local_50), !_Var3)) {
    return (plutovg_surface_t *)0x0;
  }
  fVar2 = local_50.h;
  fVar1 = local_50.w;
  if (local_50.w <= 0.0) {
    return (plutovg_surface_t *)0x0;
  }
  if (local_50.h <= 0.0) {
    return (plutovg_surface_t *)0x0;
  }
  local_38 = current_color;
  if (height < 1 && width < 1) {
    fVar4 = ceilf(local_50.w);
    width = (int)fVar4;
    fVar4 = fVar2;
  }
  else {
    if (width < 1 || 0 < height) {
      if (0 < height && width < 1) {
        fVar4 = ceilf(((float)height * local_50.w) / local_50.h);
        width = (int)fVar4;
      }
      goto LAB_00106648;
    }
    fVar4 = ((float)width * local_50.h) / local_50.w;
  }
  fVar4 = ceilf(fVar4);
  height = (int)fVar4;
LAB_00106648:
  surface = plutovg_surface_create(width,height);
  if (surface != (plutovg_surface_t *)0x0) {
    canvas = plutovg_canvas_create(surface);
    local_40 = palette_func;
    plutovg_canvas_scale(canvas,(float)width / fVar1,(float)height / fVar2);
    plutovg_canvas_translate(canvas,-local_50.x,-local_50.y);
    _Var3 = plutosvg_document_render(document,id,canvas,local_38,local_40,closure);
    plutovg_canvas_destroy(canvas);
    if (_Var3) {
      return surface;
    }
    plutovg_surface_destroy(surface);
  }
  return (plutovg_surface_t *)0x0;
}

Assistant:

plutovg_surface_t* plutosvg_document_render_to_surface(const plutosvg_document_t* document, const char* id, int width, int height, const plutovg_color_t* current_color, plutosvg_palette_func_t palette_func, void* closure)
{
    plutovg_rect_t extents = {0, 0, document->width, document->height};
    if(id && !plutosvg_document_extents(document, id, &extents))
        return NULL;
    if(extents.w <= 0.f || extents.h <= 0.f)
        return NULL;
    if(width <= 0 && height <= 0) {
        width = (int)(ceilf(extents.w));
        height = (int)(ceilf(extents.h));
    } else if(width > 0 && height <= 0) {
        height = (int)(ceilf(width * extents.h / extents.w));
    } else if(height > 0 && width <= 0) {
        width = (int)(ceilf(height * extents.w / extents.h));
    }

    plutovg_surface_t* surface = plutovg_surface_create(width, height);
    if(surface == NULL)
        return NULL;
    plutovg_canvas_t* canvas = plutovg_canvas_create(surface);
    plutovg_canvas_scale(canvas, width / extents.w, height / extents.h);
    plutovg_canvas_translate(canvas, -extents.x, -extents.y);
    if(!plutosvg_document_render(document, id, canvas, current_color, palette_func, closure)) {
        plutovg_canvas_destroy(canvas);
        plutovg_surface_destroy(surface);
        return NULL;
    }

    plutovg_canvas_destroy(canvas);
    return surface;
}